

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceSymbol,char_const(&)[1],slang::SourceLocation_const&,slang::ast::InstanceBodySymbol&>
          (BumpAllocator *this,char (*args) [1],SourceLocation *args_1,InstanceBodySymbol *args_2)

{
  string_view name;
  InstanceSymbol *pIVar1;
  SourceLocation in_RCX;
  size_t in_RDX;
  char *in_RSI;
  char *in_stack_ffffffffffffffc8;
  InstanceBodySymbol *in_stack_ffffffffffffffd0;
  InstanceSymbol *in_stack_ffffffffffffffd8;
  
  pIVar1 = (InstanceSymbol *)
           allocate((BumpAllocator *)in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0,
                    (size_t)in_stack_ffffffffffffffc8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  name._M_str = in_RSI;
  name._M_len = in_RDX;
  ast::InstanceSymbol::InstanceSymbol
            (in_stack_ffffffffffffffd8,name,in_RCX,in_stack_ffffffffffffffd0);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }